

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  uchar uVar1;
  section_impl<ELFIO::Elf64_Shdr> *psVar2;
  size_type sVar3;
  section_impl<ELFIO::Elf64_Shdr> *psVar4;
  undefined8 extraout_RDX;
  section_impl<ELFIO::Elf64_Shdr> *psStack_20;
  uchar file_class;
  section *new_section;
  elfio *this_local;
  
  new_section = (section *)this;
  uVar1 = get_class(this);
  if (uVar1 == '\x02') {
    psVar2 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0x80);
    psVar4 = psVar2;
    section_impl<ELFIO::Elf64_Shdr>::section_impl
              (psVar2,(endianess_convertor)(this->convertor).need_conversion);
    psStack_20 = psVar2;
  }
  else {
    if (uVar1 != '\x01') {
      return (section *)0x0;
    }
    psVar2 = (section_impl<ELFIO::Elf64_Shdr> *)operator_new(0x68);
    psVar4 = psVar2;
    section_impl<ELFIO::Elf32_Shdr>::section_impl
              ((section_impl<ELFIO::Elf32_Shdr> *)psVar2,
               (endianess_convertor)(this->convertor).need_conversion);
    psStack_20 = psVar2;
  }
  psVar2 = psStack_20;
  sVar3 = std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::size(&this->sections_);
  (*(psVar2->super_section)._vptr_section[0x1e])
            (psVar2,sVar3 & 0xffff,extraout_RDX,CONCAT62((int6)((ulong)psVar4 >> 0x10),(short)sVar3)
            );
  std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::push_back
            (&this->sections_,(value_type *)&stack0xffffffffffffffe0);
  return &psStack_20->super_section;
}

Assistant:

section* create_section()
    {
        section*      new_section;
        unsigned char file_class = get_class();

        if ( file_class == ELFCLASS64 ) {
            new_section = new section_impl<Elf64_Shdr>( convertor );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_section = new section_impl<Elf32_Shdr>( convertor );
        }
        else {
            return 0;
        }

        new_section->set_index( (Elf_Half)sections_.size() );
        sections_.push_back( new_section );

        return new_section;
    }